

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

void __thiscall Chromosome::createCoordinatePath(Chromosome *this,Coordinate start)

{
  pointer *ppCVar1;
  pointer pCVar2;
  iterator iVar3;
  TURNCODE *pTVar4;
  TURNCODE *pTVar5;
  Coordinate next;
  Coordinate local_48;
  Coordinate local_38;
  
  local_48.facing = start.facing;
  local_48._0_8_ = start._0_8_;
  pCVar2 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  iVar3._M_current =
       (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Coordinate,std::allocator<Coordinate>>::_M_realloc_insert<Coordinate_const&>
              ((vector<Coordinate,std::allocator<Coordinate>> *)&this->pathList,iVar3,&local_48);
  }
  else {
    (iVar3._M_current)->facing = local_48.facing;
    (iVar3._M_current)->x = local_48.x;
    (iVar3._M_current)->y = local_48.y;
    ppCVar1 = &(this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  pTVar5 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar5 != pTVar4) {
    do {
      local_38.facing = local_48.facing;
      local_38.x = local_48.x;
      local_38.y = local_48.y;
      Coordinate::turnTo(&local_38,*pTVar5);
      iVar3._M_current =
           (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Coordinate,std::allocator<Coordinate>>::_M_realloc_insert<Coordinate_const&>
                  ((vector<Coordinate,std::allocator<Coordinate>> *)&this->pathList,iVar3,&local_38)
        ;
      }
      else {
        (iVar3._M_current)->facing = local_38.facing;
        (iVar3._M_current)->x = local_38.x;
        (iVar3._M_current)->y = local_38.y;
        ppCVar1 = &(this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      local_48.facing = local_38.facing;
      local_48.x = local_38.x;
      local_48.y = local_38.y;
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != pTVar4);
  }
  return;
}

Assistant:

void Chromosome::createCoordinatePath(Coordinate start) {
    pathList.clear();
    Coordinate current = start;
    pathList.push_back(current);
    for (auto turn: turnList){
        Coordinate next = current;
        next.turnTo(turn);
        pathList.push_back(next);
        current = next;
    }
}